

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_sah_builder.h
# Opt level: O0

optional<unsigned_long> __thiscall
bvh::v2::SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::try_split
          (SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this,BBox *bbox,size_t begin,
          size_t end)

{
  Config *pCVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  reference pvVar5;
  undefined8 extraout_RDX;
  _Optional_payload_base<unsigned_long> _Var6;
  optional<unsigned_long> oVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3b8;
  unsigned_long *local_3b0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3a8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3a0;
  ulong local_398;
  size_t axis_2;
  float local_388;
  Vec<float,_3UL> local_380;
  ulong local_370;
  size_t axis;
  Split best_split;
  float leaf_cost;
  size_t end_local;
  size_t begin_local;
  BBox *bbox_local;
  SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this_local;
  bool local_320;
  size_t local_318;
  float local_310;
  size_t local_308;
  float local_300;
  BBox *local_2f8;
  size_t local_2f0;
  float local_2e8;
  greater<float> local_2e1;
  Vec<float,_3UL> *local_2e0;
  BBox *local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  Config *local_2c0;
  size_t local_2b8;
  float local_2b0;
  size_t local_2a8;
  float local_2a0;
  anon_class_16_2_94731e0a local_298;
  BBox *local_288;
  Vec<float,_3UL> *local_280;
  size_t local_278;
  float local_270;
  size_t local_268;
  float local_260;
  anon_class_16_2_94732099 local_258;
  anon_class_16_2_94731e0a *local_248;
  undefined1 local_23c [8];
  Vec<float,_3UL> v_1;
  anon_class_24_3_cfb3b071 local_210;
  size_t local_1f8;
  size_t axis_1;
  Vec<float,_3UL> *local_1e8;
  anon_class_24_3_cfb3b071 *local_1e0;
  anon_class_24_3_cfb3b071 *local_1d8;
  anon_class_24_3_cfb3b071 *local_1d0;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1b4;
  Vec<float,_3UL> d;
  anon_class_16_2_94731e0a local_f8;
  BBox *local_e8;
  Vec<float,_3UL> *local_e0;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c8;
  float local_c0;
  anon_class_16_2_94732099 local_b8;
  anon_class_16_2_94731e0a *local_a8;
  undefined1 local_9c [8];
  Vec<float,_3UL> v;
  reference local_60;
  size_type local_50;
  size_t i_1;
  size_type local_38;
  size_t i;
  size_t local_28;
  size_t local_20;
  long local_18;
  SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_10;
  
  pCVar1 = (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_;
  local_f8.a = &bbox->max;
  local_b8.f = &local_f8;
  local_b8.v = (Vec<float,_3UL> *)local_9c;
  v.values._4_8_ = &local_b8;
  local_2d8 = bbox;
  local_2d0 = end;
  local_2c8 = begin;
  local_2c0 = pCVar1;
  d.values._4_8_ = bbox;
  local_f8.b = &bbox->min;
  local_e8 = bbox;
  local_e0 = local_f8.a;
  local_a8 = local_b8.f;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v.values._4_8_,0);
  uVar4 = v.values._4_8_;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v.values._4_8_,1);
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar4,2);
  local_c0 = v.values[0];
  local_c8 = local_9c;
  local_d0 = v.values[0];
  local_d8 = local_9c;
  local_1c0 = v.values[0];
  local_1c8 = local_9c;
  local_1b4 = local_9c;
  uVar4 = local_1b4;
  d.values[0] = v.values[0];
  local_1b4._0_4_ = local_9c._0_4_;
  local_1b4._4_4_ = local_9c._4_4_;
  auVar3 = vfmadd213ss_fma(ZEXT416((uint)v.values[0]),
                           ZEXT416((uint)((float)local_1b4 + local_1b4._4_4_)),
                           ZEXT416((uint)((float)local_1b4 * local_1b4._4_4_)));
  auVar2 = vcvtusi2ss_avx512f(ZEXT416((uint)((float)local_1b4 + local_1b4._4_4_)),
                              (local_2d0 - local_2c8) + (pCVar1->sah).prim_offset_ >>
                              ((byte)(pCVar1->sah).log_cluster_size_ & 0x3f));
  best_split.pos._0_4_ = auVar3._0_4_ * (auVar2._0_4_ - (pCVar1->sah).cost_ratio_);
  axis = begin + end + 1 >> 1;
  best_split.cost = 0.0;
  best_split._12_4_ = 0;
  best_split.axis._4_4_ = (float)best_split.pos;
  local_1b4 = uVar4;
  for (local_370 = 0; local_370 < 3; local_370 = local_370 + 1) {
    find_best_split(this,local_370,begin,end,(Split *)&axis);
  }
  if (best_split.axis._4_4_ <= (float)best_split.pos) {
    if (end - begin <=
        ((this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_)->
        max_leaf_size) {
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
      _Var6._8_8_ = extraout_RDX;
      _Var6._M_payload = (_Storage<unsigned_long,_true>)this_local;
      goto LAB_00113d30;
    }
    axis = begin + 1 + end >> 1;
    local_298.a = &bbox->max;
    local_258.f = &local_298;
    local_258.v = (Vec<float,_3UL> *)local_23c;
    v_1.values._4_8_ = &local_258;
    local_2f8 = bbox;
    local_298.b = &bbox->min;
    local_288 = bbox;
    local_280 = local_298.a;
    local_248 = local_258.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_1.values._4_8_,0);
    uVar4 = v_1.values._4_8_;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_1.values._4_8_,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar4,2);
    local_260 = v_1.values[0];
    local_268 = (size_t)local_23c;
    local_2a0 = v_1.values[0];
    local_2a8 = (size_t)local_23c;
    local_270 = v_1.values[0];
    local_278 = (size_t)local_23c;
    local_2b0 = v_1.values[0];
    local_2b8 = (size_t)local_23c;
    local_300 = v_1.values[0];
    local_308 = (size_t)local_23c;
    local_2e8 = v_1.values[0];
    local_2f0 = (size_t)local_23c;
    local_310 = v_1.values[0];
    local_318 = (size_t)local_23c;
    local_388 = v_1.values[0];
    axis_2 = (size_t)local_23c;
    local_380.values[0] = (float)local_23c._0_4_;
    local_380.values[1] = (float)local_23c._4_4_;
    local_380.values[2] = v_1.values[0];
    local_2e0 = &local_380;
    local_210.compare = &local_2e1;
    local_1f8 = 0;
    local_210.axis = &local_1f8;
    local_1e0 = &local_210;
    local_210.this = local_2e0;
    axis_1 = (size_t)local_210.compare;
    local_1e8 = local_2e0;
    Vec<float,_3UL>::get_best_axis<std::greater<float>_>::anon_class_24_3_cfb3b071::operator()
              (local_1e0,1);
    local_1d8 = local_1e0;
    Vec<float,_3UL>::get_best_axis<std::greater<float>_>::anon_class_24_3_cfb3b071::operator()
              (local_1e0,2);
    local_1d0 = local_1d8;
    best_split._8_8_ = local_1f8;
  }
  local_18 = best_split._8_8_;
  local_28 = axis;
  i = end;
  local_20 = begin;
  local_10 = this;
  for (local_38 = begin; local_38 < local_28; local_38 = local_38 + 1) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (this->prim_ids_ + local_18,local_38);
    _i_1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->marks_,*pvVar5);
    std::_Bit_reference::operator=((_Bit_reference *)&i_1,true);
  }
  for (local_50 = local_28; local_50 < i; local_50 = local_50 + 1) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (this->prim_ids_ + local_18,local_50);
    local_60 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->marks_,*pvVar5);
    std::_Bit_reference::operator=(&local_60,false);
  }
  for (local_398 = 0; local_398 < 3; local_398 = local_398 + 1) {
    if (local_398 != best_split._8_8_) {
      local_3a8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (this->prim_ids_ + local_398);
      local_3a0 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+(&local_3a8,begin);
      local_3b8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (this->prim_ids_ + local_398);
      local_3b0 = (unsigned_long *)
                  __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+(&local_3b8,end);
      std::
      stable_partition<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::try_split(bvh::v2::BBox<float,3ul>const&,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>
                (local_3a0,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_3b0,(anon_class_8_1_8991fb9c)this);
    }
  }
  _Var6 = (_Optional_payload_base<unsigned_long>)std::make_optional<unsigned_long&>(&axis);
  local_320 = _Var6._M_engaged;
LAB_00113d30:
  this_local = (SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)_Var6._M_payload;
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = _Var6._9_7_;
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = local_320;
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)this_local
  ;
  return (optional<unsigned_long>)
         oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> try_split(const BBox& bbox, size_t begin, size_t end) override {
        // Find the best split over all axes
        auto leaf_cost = config_.sah.get_non_split_cost(begin, end, bbox);
        auto best_split = Split { (begin + end + 1) / 2, leaf_cost, 0 };
        for (size_t axis = 0; axis < Node::dimension; ++axis)
            find_best_split(axis, begin, end, best_split);

        // Make sure that the split is good before proceeding with it
        if (best_split.cost >= leaf_cost) {
            if (end - begin <= config_.max_leaf_size)
                return std::nullopt;

            // If the number of primitives is too high, fallback on a split at the
            // median on the largest axis.
            best_split.pos = (begin + end + 1) / 2;
            best_split.axis = bbox.get_diagonal().get_largest_axis();
        }

        // Partition primitives (keeping the order intact so that the next recursive calls do not
        // need to sort primitives again).
        mark_primitives(best_split.axis, begin, best_split.pos, end);
        for (size_t axis = 0; axis < Node::dimension; ++axis) {
            if (axis == best_split.axis)
                continue;
            std::stable_partition(
                prim_ids_[axis].begin() + begin,
                prim_ids_[axis].begin() + end,
                [&] (size_t i) { return marks_[i]; });
        }

        return std::make_optional(best_split.pos);
    }